

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlIsRef(void)

{
  int iVar1;
  int iVar2;
  xmlDocPtr val;
  xmlNodePtr val_00;
  xmlAttrPtr val_01;
  int local_44;
  int n_attr;
  xmlAttrPtr attr;
  int n_elem;
  xmlNodePtr elem;
  int n_doc;
  xmlDocPtr doc;
  int ret_val;
  int mem_base;
  int test_ret;
  
  ret_val = 0;
  for (elem._4_4_ = 0; (int)elem._4_4_ < 4; elem._4_4_ = elem._4_4_ + 1) {
    for (attr._4_4_ = 0; (int)attr._4_4_ < 3; attr._4_4_ = attr._4_4_ + 1) {
      for (local_44 = 0; local_44 < 2; local_44 = local_44 + 1) {
        iVar1 = xmlMemBlocks();
        val = gen_xmlDocPtr(elem._4_4_,0);
        val_00 = gen_xmlNodePtr(attr._4_4_,1);
        val_01 = gen_xmlAttrPtr(local_44,2);
        iVar2 = xmlIsRef(val,val_00,val_01);
        desret_int(iVar2);
        call_tests = call_tests + 1;
        des_xmlDocPtr(elem._4_4_,val,0);
        des_xmlNodePtr(attr._4_4_,val_00,1);
        des_xmlAttrPtr(local_44,val_01,2);
        xmlResetLastError();
        iVar2 = xmlMemBlocks();
        if (iVar1 != iVar2) {
          iVar2 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlIsRef",(ulong)(uint)(iVar2 - iVar1));
          ret_val = ret_val + 1;
          printf(" %d",(ulong)elem._4_4_);
          printf(" %d",(ulong)attr._4_4_);
          printf(" %d");
          printf("\n");
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val;
}

Assistant:

static int
test_xmlIsRef(void) {
    int test_ret = 0;

    int mem_base;
    int ret_val;
    xmlDocPtr doc; /* the document */
    int n_doc;
    xmlNodePtr elem; /* the element carrying the attribute */
    int n_elem;
    xmlAttrPtr attr; /* the attribute */
    int n_attr;

    for (n_doc = 0;n_doc < gen_nb_xmlDocPtr;n_doc++) {
    for (n_elem = 0;n_elem < gen_nb_xmlNodePtr;n_elem++) {
    for (n_attr = 0;n_attr < gen_nb_xmlAttrPtr;n_attr++) {
        mem_base = xmlMemBlocks();
        doc = gen_xmlDocPtr(n_doc, 0);
        elem = gen_xmlNodePtr(n_elem, 1);
        attr = gen_xmlAttrPtr(n_attr, 2);

        ret_val = xmlIsRef(doc, elem, attr);
        desret_int(ret_val);
        call_tests++;
        des_xmlDocPtr(n_doc, doc, 0);
        des_xmlNodePtr(n_elem, elem, 1);
        des_xmlAttrPtr(n_attr, attr, 2);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlIsRef",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_doc);
            printf(" %d", n_elem);
            printf(" %d", n_attr);
            printf("\n");
        }
    }
    }
    }
    function_tests++;

    return(test_ret);
}